

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O1

void __thiscall mir::inst::CallInst::display(CallInst *this,ostream *o)

{
  pointer pVVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::__ostream_insert<char,std::char_traits<char>>(o," = ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->func)._M_dataplus._M_p,(this->func)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  if ((this->params).super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (this->params).super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl
      .super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
      }
      pVVar1 = (this->params).
               super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      (*(code *)**(undefined8 **)((long)&(pVVar1->super_Displayable)._vptr_Displayable + lVar3))
                ((long)&(pVVar1->super_Displayable)._vptr_Displayable + lVar3,o);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < (ulong)((long)(this->params).
                                   super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->params).
                                   super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
  return;
}

Assistant:

void CallInst::display(std::ostream& o) const {
  o << dest << " = " << func << "(";
  for (size_t i = 0; i < params.size(); i++) {
    if (i != 0) o << ", ";
    o << params[i];
  }
  o << ")";
}